

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fill<kj::StringPtr,kj::String&,kj::StringPtr&>
                 (char *target,StringPtr *first,String *rest,StringPtr *rest_1)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (first->content).ptr;
  sVar1 = (first->content).size_;
  for (lVar3 = 0; sVar1 - 1 != lVar3; lVar3 = lVar3 + 1) {
    target[lVar3] = pcVar2[lVar3];
  }
  pcVar2 = fill<kj::String,kj::StringPtr&>(target + lVar3,rest,rest_1);
  return pcVar2;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }